

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_A_OverlayFlags(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  PClass *pPVar6;
  undefined8 uVar7;
  PClass *pPVar8;
  DPSprite *pDVar9;
  undefined4 in_register_00000014;
  VMValue *pVVar10;
  char *pcVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  uVar7 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_0052ea9b;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar4 = (undefined8 *)(param->field_0).field_1.a;
    pVVar10 = param;
    if (puVar4 != (undefined8 *)0x0) {
      if (puVar4[1] == 0) {
        auVar13 = (**(code **)*puVar4)(puVar4);
        uVar7 = auVar13._8_8_;
        puVar4[1] = auVar13._0_8_;
      }
      pPVar8 = (PClass *)puVar4[1];
      bVar12 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar12;
      uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),bVar12);
      pVVar10 = (VMValue *)(ulong)(pPVar8 == pPVar6 || bVar12);
      if (pPVar8 != pPVar6 && !bVar12) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar6) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052ea9b;
      }
    }
    pPVar6 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0052e9f2;
      puVar5 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar5 != (undefined8 *)0x0) {
        if (puVar5[1] == 0) {
          uVar7 = (**(code **)*puVar5)(puVar5,pVVar10,uVar7,ret);
          puVar5[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar5[1];
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar6 && bVar12) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar12 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar6) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar12) {
          pcVar11 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052ea9b;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      if (numparam < 4) {
        pcVar11 = "(paramnum) < numparam";
      }
      else {
        if (param[3].field_0.field_3.Type == '\0') {
          if (numparam == 4) {
            pcVar11 = "(paramnum) < numparam";
          }
          else {
            if (param[4].field_0.field_3.Type == '\0') {
              if (numparam < 6) {
                pcVar11 = "(paramnum) < numparam";
              }
              else {
                if (param[5].field_0.field_3.Type == '\0') {
                  if ((player_t *)puVar4[0x40] != (player_t *)0x0) {
                    uVar2 = param[4].field_0.i;
                    iVar3 = param[5].field_0.i;
                    pDVar9 = player_t::FindPSprite((player_t *)puVar4[0x40],param[3].field_0.i);
                    if (pDVar9 != (DPSprite *)0x0) {
                      if (iVar3 == 0) {
                        pDVar9->Flags = pDVar9->Flags & ~uVar2;
                      }
                      else {
                        pDVar9->Flags = pDVar9->Flags | uVar2;
                      }
                    }
                  }
                  return 0;
                }
                pcVar11 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar11,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x408,
                            "int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            pcVar11 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x407,
                        "int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        pcVar11 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x406,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_0052e9f2:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0052ea9b:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_OverlayFlags)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT(layer);
	PARAM_INT(flags);
	PARAM_BOOL(set);

	if (self->player == nullptr)
		return 0;

	DPSprite *pspr = self->player->FindPSprite(layer);

	if (pspr == nullptr)
		return 0;

	if (set)
		pspr->Flags |= flags;
	else
		pspr->Flags &= ~flags;

	return 0;
}